

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

Maybe<kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_> *
kj::parse::
Many_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_&,_false>
::
Impl<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>
::apply(Maybe<kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_>
        *__return_storage_ptr__,
       ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>
       *subParser,
       IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
       *input)

{
  bool bVar1;
  NullableValue<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_> *other;
  Orphan<capnp::compiler::Declaration::AnnotationApplication> *pOVar2;
  Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_> local_100;
  int local_e4;
  Orphan<capnp::compiler::Declaration::AnnotationApplication> *local_e0;
  Orphan<capnp::compiler::Declaration::AnnotationApplication> *subResult;
  undefined1 local_b0 [8];
  NullableValue<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_> _subResult425;
  IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
  subInput;
  undefined1 local_40 [8];
  Results results;
  IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
  *input_local;
  ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>
  *subParser_local;
  
  results.builder.disposer = (ArrayDisposer *)input;
  Vector<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>::Vector
            ((Vector<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_> *)local_40
            );
  do {
    bVar1 = IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
            ::atEnd((IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
                     *)results.builder.disposer);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
    ::IteratorInput((IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
                     *)&_subResult425.field_1.value.builder.location,
                    (IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
                     *)results.builder.disposer);
    ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>
    ::operator()((Maybe<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_> *)
                 &subResult,subParser,
                 (IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
                  *)&_subResult425.field_1.value.builder.location);
    other = kj::_::readMaybe<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>>
                      ((Maybe<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_> *
                       )&subResult);
    kj::_::NullableValue<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>::
    NullableValue((NullableValue<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>
                   *)local_b0,other);
    Maybe<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>::~Maybe
              ((Maybe<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_> *)
               &subResult);
    pOVar2 = kj::_::NullableValue::operator_cast_to_Orphan_((NullableValue *)local_b0);
    if (pOVar2 == (Orphan<capnp::compiler::Declaration::AnnotationApplication> *)0x0) {
      local_e4 = 3;
    }
    else {
      local_e0 = kj::_::
                 NullableValue<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>
                 ::operator*((NullableValue<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>
                              *)local_b0);
      IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
      ::advanceParent((IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
                       *)&_subResult425.field_1.value.builder.location);
      pOVar2 = mv<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>>(local_e0);
      Vector<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>>::
      add<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>>
                ((Vector<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>> *)
                 local_40,pOVar2);
      local_e4 = 0;
    }
    kj::_::NullableValue<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>::
    ~NullableValue((NullableValue<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>
                    *)local_b0);
    if (local_e4 == 0) {
      local_e4 = 0;
    }
    IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
    ::~IteratorInput((IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
                      *)&_subResult425.field_1.value.builder.location);
  } while (local_e4 == 0);
  Vector<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>::releaseAsArray
            (&local_100,
             (Vector<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_> *)local_40
            );
  Maybe<kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_>::Maybe
            (__return_storage_ptr__,&local_100);
  Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>::~Array(&local_100);
  local_e4 = 1;
  Vector<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>::~Vector
            ((Vector<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_> *)local_40
            );
  return __return_storage_ptr__;
}

Assistant:

static Maybe<Array<Output>> apply(const SubParser& subParser, Input& input) {
    typedef Vector<OutputType<SubParser, Input>> Results;
    Results results;

    while (!input.atEnd()) {
      Input subInput(input);

      KJ_IF_SOME(subResult, subParser(subInput)) {
        subInput.advanceParent();
        results.add(kj::mv(subResult));
      } else {
        break;
      }
    }